

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O2

void __thiscall
CP::priority_queue<int,_std::less<int>_>::push
          (priority_queue<int,_std::less<int>_> *this,int *element)

{
  ulong uVar1;
  size_t idx;
  
  idx = this->mSize;
  uVar1 = idx + 1;
  if (this->mCap < uVar1) {
    expand(this,this->mCap * 2);
    idx = this->mSize;
    uVar1 = idx + 1;
  }
  this->mData[idx] = *element;
  this->mSize = uVar1;
  fixUp(this,idx);
  return;
}

Assistant:

void push(const T& element) {
      if (mSize + 1 > mCap)
        expand(mCap * 2);
      mData[mSize] = element;
      mSize++;
      fixUp(mSize-1);
    }